

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphPrepare(Nwk_Grf_t *p)

{
  int iVar1;
  int *piVar2;
  void *__ptr;
  Aig_MmFlex_t *pAVar3;
  Nwk_Vrt_t **ppNVar4;
  Nwk_Vrt_t *pNVar5;
  int iVar6;
  int local_30;
  int i;
  int nBytes;
  int *pnEdges;
  Nwk_Vrt_t *pVertex;
  Nwk_Edg_t *pEntry;
  Nwk_Grf_t *p_local;
  
  piVar2 = (int *)malloc((long)(p->nObjs + 1) << 2);
  p->pMapLut2Id = piVar2;
  piVar2 = (int *)malloc((long)(p->nVertsMax + 1) << 2);
  p->pMapId2Lut = piVar2;
  memset(p->pMapLut2Id,0xff,(long)(p->nObjs + 1) << 2);
  memset(p->pMapId2Lut,0xff,(long)(p->nVertsMax + 1) << 2);
  for (local_30 = 0; local_30 < p->nEdgeHash; local_30 = local_30 + 1) {
    for (pVertex = (Nwk_Vrt_t *)p->pEdgeHash[local_30]; pVertex != (Nwk_Vrt_t *)0x0;
        pVertex = *(Nwk_Vrt_t **)&pVertex->iNext) {
      if (p->nObjs < pVertex->Id) {
        __assert_fail("pEntry->iNode1 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x121,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if (p->nObjs < pVertex->iPrev) {
        __assert_fail("pEntry->iNode2 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x122,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      p->pMapLut2Id[pVertex->Id] = 0;
      p->pMapLut2Id[pVertex->iPrev] = 0;
    }
  }
  p->nVerts = 0;
  for (local_30 = 0; local_30 <= p->nObjs; local_30 = local_30 + 1) {
    if (p->pMapLut2Id[local_30] == 0) {
      iVar6 = p->nVerts + 1;
      p->nVerts = iVar6;
      p->pMapLut2Id[local_30] = iVar6;
      p->pMapId2Lut[p->nVerts] = local_30;
    }
  }
  __ptr = calloc((long)(p->nVerts + 1),4);
  local_30 = 0;
  do {
    if (p->nEdgeHash <= local_30) {
      pAVar3 = Aig_MmFlexStart();
      p->pMemVerts = pAVar3;
      ppNVar4 = (Nwk_Vrt_t **)malloc((long)(p->nVerts + 1) << 3);
      p->pVerts = ppNVar4;
      *p->pVerts = (Nwk_Vrt_t *)0x0;
      local_30 = 1;
      while( true ) {
        if (p->nVerts < local_30) {
          for (local_30 = 0; local_30 < p->nEdgeHash; local_30 = local_30 + 1) {
            for (pVertex = (Nwk_Vrt_t *)p->pEdgeHash[local_30]; pVertex != (Nwk_Vrt_t *)0x0;
                pVertex = *(Nwk_Vrt_t **)&pVertex->iNext) {
              pNVar5 = p->pVerts[pVertex->Id];
              iVar6 = pVertex->iPrev;
              iVar1 = pNVar5->nEdges;
              pNVar5->nEdges = iVar1 + 1;
              (&pNVar5[1].Id)[iVar1] = iVar6;
              pNVar5 = p->pVerts[pVertex->iPrev];
              iVar6 = pVertex->Id;
              iVar1 = pNVar5->nEdges;
              pNVar5->nEdges = iVar1 + 1;
              (&pNVar5[1].Id)[iVar1] = iVar6;
            }
          }
          local_30 = 1;
          while( true ) {
            if (p->nVerts < local_30) {
              Aig_MmFixedStop(p->pMemEdges,0);
              p->pMemEdges = (Aig_MmFixed_t *)0x0;
              if (p->pEdgeHash != (Nwk_Edg_t **)0x0) {
                free(p->pEdgeHash);
                p->pEdgeHash = (Nwk_Edg_t **)0x0;
              }
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              return;
            }
            if (p->pVerts[local_30]->nEdges != *(int *)((long)__ptr + (long)local_30 * 4)) break;
            Nwk_ManGraphListInsert(p,p->pVerts[local_30]);
            local_30 = local_30 + 1;
          }
          __assert_fail("p->pVerts[i]->nEdges == pnEdges[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x156,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        if (*(int *)((long)__ptr + (long)local_30 * 4) < 1) break;
        iVar6 = *(int *)((long)__ptr + (long)local_30 * 4) * 4 + 0x10;
        pNVar5 = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch(p->pMemVerts,iVar6);
        p->pVerts[local_30] = pNVar5;
        memset(p->pVerts[local_30],0,(long)iVar6);
        p->pVerts[local_30]->Id = local_30;
        local_30 = local_30 + 1;
      }
      __assert_fail("pnEdges[i] > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x145,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
    }
    for (pVertex = (Nwk_Vrt_t *)p->pEdgeHash[local_30]; pVertex != (Nwk_Vrt_t *)0x0;
        pVertex = *(Nwk_Vrt_t **)&pVertex->iNext) {
      if (p->nObjs < pVertex->Id) {
        __assert_fail("pEntry->iNode1 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x135,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if (p->nObjs < pVertex->iPrev) {
        __assert_fail("pEntry->iNode2 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x136,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      pVertex->Id = p->pMapLut2Id[pVertex->Id];
      pVertex->iPrev = p->pMapLut2Id[pVertex->iPrev];
      if (p->nVerts < pVertex->Id) {
        __assert_fail("pEntry->iNode1 <= p->nVerts",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x13a,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if (p->nVerts < pVertex->iPrev) {
        __assert_fail("pEntry->iNode2 <= p->nVerts",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x13b,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      *(int *)((long)__ptr + (long)pVertex->Id * 4) =
           *(int *)((long)__ptr + (long)pVertex->Id * 4) + 1;
      *(int *)((long)__ptr + (long)pVertex->iPrev * 4) =
           *(int *)((long)__ptr + (long)pVertex->iPrev * 4) + 1;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Nwk_ManGraphPrepare( Nwk_Grf_t * p )
{
    Nwk_Edg_t * pEntry;
    Nwk_Vrt_t * pVertex;
    int * pnEdges, nBytes, i;
    // allocate memory for the present objects
    p->pMapLut2Id = ABC_ALLOC( int, p->nObjs+1 );
    p->pMapId2Lut = ABC_ALLOC( int, p->nVertsMax+1 );
    memset( p->pMapLut2Id, 0xff, sizeof(int) * (p->nObjs+1) );
    memset( p->pMapId2Lut, 0xff, sizeof(int) * (p->nVertsMax+1) );
    // mark present objects
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        p->pMapLut2Id[ pEntry->iNode1 ] = 0;
        p->pMapLut2Id[ pEntry->iNode2 ] = 0;
    }
    // map objects
    p->nVerts = 0;
    for ( i = 0; i <= p->nObjs; i++ )
    {
        if ( p->pMapLut2Id[i] == 0 )
        {
            p->pMapLut2Id[i] = ++p->nVerts;
            p->pMapId2Lut[p->nVerts] = i;
        }
    }
    // count the edges and mark present objects
    pnEdges = ABC_CALLOC( int, p->nVerts+1 );
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        // translate into vertices
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        pEntry->iNode1 = p->pMapLut2Id[pEntry->iNode1];
        pEntry->iNode2 = p->pMapLut2Id[pEntry->iNode2];
        // count the edges
        assert( pEntry->iNode1 <= p->nVerts );
        assert( pEntry->iNode2 <= p->nVerts );
        pnEdges[pEntry->iNode1]++;
        pnEdges[pEntry->iNode2]++;
    }
    // allocate the real graph
    p->pMemVerts  = Aig_MmFlexStart();
    p->pVerts = ABC_ALLOC( Nwk_Vrt_t *, p->nVerts + 1 );
    p->pVerts[0] = NULL;
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( pnEdges[i] > 0 );
        nBytes = sizeof(Nwk_Vrt_t) + sizeof(int) * pnEdges[i];
        p->pVerts[i] = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch( p->pMemVerts, nBytes );
        memset( p->pVerts[i], 0, nBytes );
        p->pVerts[i]->Id = i;
    }
    // add edges to the real graph
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        pVertex = p->pVerts[pEntry->iNode1];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode2;
        pVertex = p->pVerts[pEntry->iNode2];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode1;
    }
    // put vertices into the data structure
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( p->pVerts[i]->nEdges == pnEdges[i] );
        Nwk_ManGraphListInsert( p, p->pVerts[i] );
    }
    // clean up
    Aig_MmFixedStop( p->pMemEdges, 0 ); p->pMemEdges = NULL;
    ABC_FREE( p->pEdgeHash );
//    p->nEdgeHash = 0;
    ABC_FREE( pnEdges );
}